

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_ManDfsAll_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                        ,0xc5,"void Aig_ManDfsAll_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Aig_ManDfsAll_rec(p,pAVar2,vNodes);
        pAVar2 = Aig_ObjFanin1(pObj);
        Aig_ManDfsAll_rec(p,pAVar2,vNodes);
        Vec_PtrPush(vNodes,pObj);
      }
      else {
        pAVar2 = Aig_ObjFanin0(pObj);
        Aig_ManDfsAll_rec(p,pAVar2,vNodes);
        Vec_PtrPush(vNodes,pObj);
      }
    }
    else {
      Vec_PtrPush(vNodes,pObj);
    }
  }
  return;
}

Assistant:

void Aig_ManDfsAll_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}